

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

lua_Number luaL_checknumber(lua_State *L,int idx)

{
  ulong uVar1;
  int iVar2;
  TValue *o;
  ulong uVar3;
  TValue tmp;
  TValue local_20;
  
  o = index2adr(L,idx);
  uVar1 = o->it64;
  uVar3 = (long)uVar1 >> 0x2f;
  if (uVar3 < 0xfffffffffffffff3) {
LAB_0010f57e:
    return (lua_Number)o->u64;
  }
  if (uVar3 == 0xfffffffffffffffb) {
    o = &local_20;
    iVar2 = lj_strscan_num((GCstr *)(uVar1 & 0x7fffffffffff),o);
    if (iVar2 != 0) goto LAB_0010f57e;
  }
  lj_err_argt(L,idx,3);
}

Assistant:

LUALIB_API lua_Number luaL_checknumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (!(tvisstr(o) && lj_strscan_num(strV(o), &tmp)))
    lj_err_argt(L, idx, LUA_TNUMBER);
  return numV(&tmp);
}